

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O0

void send_recv_start(void)

{
  int iVar1;
  int r;
  
  iVar1 = uv_is_readable(0x2cdea0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x160,"1 == uv_is_readable((uv_stream_t*)&ctx2.channel)");
    abort();
  }
  iVar1 = uv_is_writable(0x2cdea0);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x161,"1 == uv_is_writable((uv_stream_t*)&ctx2.channel)");
    abort();
  }
  iVar1 = uv_is_closing(0x2cdea0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x162,"0 == uv_is_closing((uv_handle_t*)&ctx2.channel)");
    abort();
  }
  iVar1 = uv_read_start(0x2cdea0,alloc_cb,read_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
            ,0x165,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT(1 == uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT(r == 0);
}